

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPubkey
          (ExtPubkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  CfdException *this_00;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::GetExtPubkey(__return_storage_ptr__,&this->extprivkey_);
  }
  else {
    if (this->key_type_ != kDescriptorKeyBip32) {
      local_38._0_8_ = "cfdcore_descriptor.cpp";
      local_38._8_4_ = 0x1ac;
      local_38._16_8_ = "GetExtPubkey";
      logger::warn<>((CfdSourceLocation *)local_38,"Failed to GetExtPubkey. unsupported key type.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_38,"GetExtPubkey unsupported key type.",&local_39);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_38);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::ExtPubkey(__return_storage_ptr__,&this->extpubkey_);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey DescriptorKeyReference::GetExtPubkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) {
    return extpubkey_;
  }
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_.GetExtPubkey();
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPubkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPubkey unsupported key type.");
}